

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void * __thiscall rlist::listSearchKey(rlist *this,void *value)

{
  int iVar1;
  void *value_local;
  rlist *this_local;
  
  if (this->rl->head != (listNode *)0x0) {
    this->view = this->rl->head;
    while (this->view != (listNode *)0x0) {
      iVar1 = match(this,this->view,value);
      if (iVar1 != 0) {
        return this->view;
      }
      this->view = this->view->next;
    }
  }
  return (void *)0x0;
}

Assistant:

void * rlist::listSearchKey(void *value){
    if(rl->head!=NULL){
        view=rl->head;
        while(view!=NULL){
            if(rlist::match(view,value))
                return view;
            view=view->next;
        }
    }
    return NULL;
}